

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O1

void __thiscall
amrex::SplineDistFcnElement2d::dxbydt
          (SplineDistFcnElement2d *this,Real t,Real y0,Real y1,Real D0,Real D1,Real *dyf,Real *d2yf)

{
  double dVar1;
  double dVar2;
  
  dVar2 = ((y1 - y0) * 3.0 - (D0 + D0)) - D1;
  dVar1 = (y0 - y1) + (y0 - y1) + D0 + D1;
  dVar2 = dVar2 + dVar2;
  *dyf = dVar1 * 3.0 * t * t + dVar2 * t + D0;
  *d2yf = dVar1 * 6.0 * t + dVar2;
  return;
}

Assistant:

void SplineDistFcnElement2d::dxbydt(amrex::Real t,
                                    amrex::Real y0, amrex::Real y1,
                                    amrex::Real D0, amrex::Real D1,
                                    amrex::Real& dyf, amrex::Real& d2yf)
                                    const {
  amrex::Real c, d;
  c = 3.0*(y1 - y0) - 2.0*D0 - D1;
  d = 2.0*(y0-y1) + D0 + D1;

  dyf = D0 + 2.0*c*t + 3.0*d*t*t;
  d2yf = 2.0*c + 6.0*d*t;
  return;
}